

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O0

void __thiscall
floorplan::GraphStatistics::saveDistToFile
          (GraphStatistics *this,string *filename,DistVectorByLabel *dist)

{
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  uint local_240;
  uint i;
  _Self local_230;
  _Self local_228;
  iterator it;
  ofstream out;
  DistVectorByLabel *dist_local;
  string *filename_local;
  GraphStatistics *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&it,pcVar2,_S_out);
  local_228._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
       ::begin(dist);
  while( true ) {
    local_230._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
         ::end(dist);
    bVar1 = std::operator!=(&local_228,&local_230);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
             ::operator->(&local_228);
    poVar4 = std::operator<<((ostream *)&it,(string *)ppVar3);
    std::operator<<(poVar4,", ");
    local_240 = 0;
    while( true ) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
               ::operator->(&local_228);
      sVar5 = std::vector<double,_std::allocator<double>_>::size(&ppVar3->second);
      if (sVar5 <= local_240) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
               ::operator->(&local_228);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&ppVar3->second,(ulong)local_240);
      poVar4 = (ostream *)std::ostream::operator<<(&it,*pvVar6);
      std::operator<<(poVar4," ");
      local_240 = local_240 + 1;
    }
    std::ostream::operator<<(&it,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
    ::operator++(&local_228);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&it);
  return;
}

Assistant:

void GraphStatistics::saveDistToFile(string filename, DistVectorByLabel dist){
    std::ofstream out(filename.c_str() );
    DistVectorByLabel::iterator it = dist.begin();

    for (; it != dist.end(); ++it){
        out << it->first << ", ";
        for (unsigned int i = 0; i < it->second.size(); i++){
            out << it->second[i] << " ";
        }
        out << endl;
    }
    out.close();
}